

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.h
# Opt level: O2

void UnitTest::CheckEqual<char[41],std::__cxx11::string>
               (TestResults *results,char (*expected) [41],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual,
               TestDetails *details)

{
  bool bVar1;
  ostream *poVar2;
  char *failure;
  MemoryOutStream stream;
  MemoryOutStream local_1c0;
  
  bVar1 = std::operator==(*expected,actual);
  if (!bVar1) {
    MemoryOutStream::MemoryOutStream(&local_1c0);
    poVar2 = std::operator<<((ostream *)&local_1c0,"Expected ");
    poVar2 = std::operator<<(poVar2,*expected);
    poVar2 = std::operator<<(poVar2," but was ");
    std::operator<<(poVar2,(string *)actual);
    failure = MemoryOutStream::GetText(&local_1c0);
    TestResults::OnTestFailure(results,details,failure);
    MemoryOutStream::~MemoryOutStream(&local_1c0);
  }
  return;
}

Assistant:

void CheckEqual(TestResults& results, Expected const& expected, Actual const& actual, TestDetails const& details)
{
    if (!(expected == actual))
    {
        UnitTest::MemoryOutStream stream;
        stream << "Expected " << expected << " but was " << actual;

        results.OnTestFailure(details, stream.GetText());
    }
}